

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall AmpIO::ReadEncoderPreload(AmpIO *this,uint index,int32_t *sdata)

{
  BasePort *pBVar1;
  uint uVar2;
  int32_t local_28;
  uint channel;
  uint32_t read_data;
  bool ret;
  int32_t *sdata_local;
  AmpIO *pAStack_10;
  uint index_local;
  AmpIO *this_local;
  
  channel._3_1_ = false;
  if (((this->super_FpgaIO).super_BoardIO.port != (BasePort *)0x0) && (index < this->NumEncoders)) {
    pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
    _read_data = sdata;
    sdata_local._4_4_ = index;
    pAStack_10 = this;
    uVar2 = (*pBVar1->_vptr_BasePort[0x23])
                      (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
                       (ulong)((index + 1) * 0x10 | 4),&local_28);
    channel._3_1_ = (byte)uVar2 & 1;
    if ((uVar2 & 1) != 0) {
      *_read_data = local_28;
    }
  }
  return (bool)channel._3_1_;
}

Assistant:

bool AmpIO::ReadEncoderPreload(unsigned int index, int32_t &sdata) const
{
    bool ret = false;
    if (port && (index < NumEncoders)) {
        uint32_t read_data;
        unsigned int channel = (index+1) << 4;
        ret = port->ReadQuadlet(BoardId, channel | ENC_LOAD_REG, read_data);
        if (ret) sdata = static_cast<int32_t>(read_data);
    }
    return ret;
}